

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JaegerPropagator.h
# Opt level: O0

StrMap * jaegertracing::propagation::
         JaegerPropagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&>
         ::parseCommaSeparatedMap(StrMap *__return_storage_ptr__,string *escapedValue)

{
  bool bVar1;
  istream *piVar2;
  long lVar3;
  mapped_type *this;
  string local_238 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> key;
  size_type eqPos;
  string piece;
  string local_1c0;
  istringstream local_1a0 [8];
  istringstream iss;
  string *escapedValue_local;
  StrMap *map;
  
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map(__return_storage_ptr__);
  net::URI::queryUnescape(&local_1c0,escapedValue);
  std::__cxx11::istringstream::istringstream(local_1a0,(string *)&local_1c0,_S_in);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::string((string *)&eqPos);
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1a0,(string *)&eqPos,',');
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) break;
    lVar3 = std::__cxx11::string::find((char)&eqPos,0x3d);
    if (lVar3 != -1) {
      std::__cxx11::string::substr((ulong)((long)&value.field_2 + 8),(ulong)&eqPos);
      std::__cxx11::string::substr((ulong)local_238,(ulong)&eqPos);
      this = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](__return_storage_ptr__,(key_type *)((long)&value.field_2 + 8));
      std::__cxx11::string::operator=((string *)this,local_238);
      std::__cxx11::string::~string(local_238);
      std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
    }
  }
  std::__cxx11::string::~string((string *)&eqPos);
  std::__cxx11::istringstream::~istringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

static StrMap parseCommaSeparatedMap(const std::string& escapedValue)
    {
        StrMap map;
        std::istringstream iss(net::URI::queryUnescape(escapedValue));
        std::string piece;
        while (std::getline(iss, piece, ',')) {
            const auto eqPos = piece.find('=');
            if (eqPos != std::string::npos) {
                const auto key = piece.substr(0, eqPos);
                const auto value = piece.substr(eqPos + 1);
                map[key] = value;
            }
        }
        return map;
    }